

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

int multissl_init(Curl_ssl *backend)

{
  int iVar1;
  char *first;
  int local_2c;
  int i;
  char *env_tmp;
  char *env;
  Curl_ssl *backend_local;
  
  if (Curl_ssl == &Curl_ssl_multi) {
    if (backend == (Curl_ssl *)0x0) {
      if (available_backends[0] == (Curl_ssl *)0x0) {
        backend_local._4_4_ = 1;
      }
      else {
        first = curl_getenv("CURL_SSL_BACKEND");
        if (first != (char *)0x0) {
          for (local_2c = 0; available_backends[local_2c] != (Curl_ssl *)0x0;
              local_2c = local_2c + 1) {
            iVar1 = Curl_strcasecompare(first,(available_backends[local_2c]->info).name);
            if (iVar1 != 0) {
              Curl_ssl = available_backends[local_2c];
              curl_free(first);
              return 0;
            }
          }
        }
        Curl_ssl = available_backends[0];
        curl_free(first);
        backend_local._4_4_ = 0;
      }
    }
    else {
      backend_local._4_4_ = 0;
      Curl_ssl = backend;
    }
  }
  else {
    backend_local._4_4_ = 1;
  }
  return backend_local._4_4_;
}

Assistant:

static int multissl_init(const struct Curl_ssl *backend)
{
  const char *env;
  char *env_tmp;

  if(Curl_ssl != &Curl_ssl_multi)
    return 1;

  if(backend) {
    Curl_ssl = backend;
    return 0;
  }

  if(!available_backends[0])
    return 1;

  env = env_tmp = curl_getenv("CURL_SSL_BACKEND");
#ifdef CURL_DEFAULT_SSL_BACKEND
  if(!env)
    env = CURL_DEFAULT_SSL_BACKEND;
#endif
  if(env) {
    int i;
    for(i = 0; available_backends[i]; i++) {
      if(strcasecompare(env, available_backends[i]->info.name)) {
        Curl_ssl = available_backends[i];
        curl_free(env_tmp);
        return 0;
      }
    }
  }

  /* Fall back to first available backend */
  Curl_ssl = available_backends[0];
  curl_free(env_tmp);
  return 0;
}